

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<short,unsigned_long>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,short *t_lhs,short *c_lhs,
          unsigned_long *c_rhs)

{
  short sVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar4;
  
  switch(t_oper) {
  case equals:
    b = *c_rhs == (long)*c_lhs;
    goto LAB_00312f8c;
  case less_than:
    b = (ulong)(long)*c_lhs < *c_rhs;
    goto LAB_00312f8c;
  case greater_than:
    b = *c_rhs < (ulong)(long)*c_lhs;
    goto LAB_00312f8c;
  case less_than_equal:
    b = (ulong)(long)*c_lhs <= *c_rhs;
    goto LAB_00312f8c;
  case greater_than_equal:
    b = *c_rhs <= (ulong)(long)*c_lhs;
    goto LAB_00312f8c;
  case not_equal:
    b = *c_rhs != (long)*c_lhs;
LAB_00312f8c:
    BVar4 = const_var((chaiscript *)this,b);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_00312fae;
  default:
    if (t_lhs == (short *)0x0) {
switchD_00312ffe_caseD_7:
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__bad_cast_003bf5e0;
      __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    switch(t_oper) {
    case assign:
      sVar1 = (short)*c_rhs;
      goto LAB_00313091;
    default:
      goto switchD_00312ffe_caseD_7;
    case assign_product:
      sVar1 = *t_lhs * (short)*c_rhs;
LAB_00313091:
      *t_lhs = sVar1;
      break;
    case assign_sum:
      *t_lhs = *t_lhs + (short)*c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_long>(*c_rhs);
      *t_lhs = (short)((ulong)(long)*t_lhs / *c_rhs);
      break;
    case assign_difference:
      *t_lhs = *t_lhs - (short)*c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_long>(*c_rhs);
      *t_lhs = *t_lhs & (ushort)*c_rhs;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | (ushort)*c_rhs;
      break;
    case assign_shift_left:
      sVar1 = *t_lhs << ((byte)*c_rhs & 0x1f);
      goto LAB_00313067;
    case assign_shift_right:
      sVar1 = (short)((int)*t_lhs >> ((byte)*c_rhs & 0x1f));
LAB_00313067:
      *t_lhs = sVar1;
      break;
    case assign_remainder:
      *t_lhs = (short)((ulong)(long)*t_lhs % *c_rhs);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ (ushort)*c_rhs;
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
    _Var3._M_pi = extraout_RDX;
    goto LAB_00312fae;
  case shift_left:
    goto LAB_00312f48;
  case shift_right:
LAB_00312f48:
    BVar4 = detail::const_var_impl<int>((int *)this);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_00312fae;
  case remainder:
    check_divide_by_zero<unsigned_long>(*c_rhs);
    break;
  case bitwise_and:
    break;
  case bitwise_or:
    break;
  case bitwise_xor:
    break;
  case sum:
    break;
  case quotient:
    check_divide_by_zero<unsigned_long>(*c_rhs);
    break;
  case product:
    break;
  case difference:
  }
  BVar4 = detail::const_var_impl<unsigned_long>((unsigned_long *)this);
  _Var3._M_pi = BVar4.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00312fae:
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }